

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::SendPetition(CommissionerImpl *this,PetitionHandler *aHandler)

{
  char cVar1;
  type tVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  Error error;
  writer write;
  anon_class_40_2_1bbb15e4 onResponse;
  Request request;
  undefined1 local_1d8 [8];
  pointer local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  type local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  parse_func local_160 [1];
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  string local_130;
  writer local_110;
  CommissionerImpl *local_108;
  _Any_data local_100;
  code *local_f0;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  Message local_b8;
  
  local_1a8 = local_198;
  local_1b0 = 0;
  local_1a0 = 0;
  local_198[0] = 0;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  local_108 = this;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
              *)&local_100,aHandler);
  if (this->mState == kConnected) {
    local_1d8 = (undefined1  [8])&local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/c/cp","");
    coap::Message::SetUriPath((Error *)local_188,&local_b8,(string *)local_1d8);
    local_1b0 = local_188._0_4_;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_180);
    tVar2 = local_1b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &local_170) {
      operator_delete(local_180._M_p);
    }
    if (local_1d8 != (undefined1  [8])&local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if (tVar2 != none_type) goto LAB_0015786b;
    tlv::Tlv::Tlv((Tlv *)local_1d8,kCommissionerId,&(this->mConfig).mId,kMeshCoP);
    AppendTlv((Error *)local_188,&local_b8,(Tlv *)local_1d8);
    local_1b0 = local_188._0_4_;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_180);
    tVar2 = local_1b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &local_170) {
      operator_delete(local_180._M_p);
    }
    if (local_1d0 != (pointer)0x0) {
      operator_delete(local_1d0);
    }
    if (tVar2 != none_type) goto LAB_0015786b;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      SignRequest((Error *)local_188,this,&local_b8,kMeshCoP,true);
      local_1b0 = local_188._0_4_;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_180);
      tVar2 = local_1b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p);
      }
      if (tVar2 != none_type) goto LAB_0015786b;
    }
    this->mState = kPetitioning;
    local_148 = (code *)0x0;
    pcStack_140 = (code *)0x0;
    local_158._M_unused._M_object = (void *)0x0;
    local_158._8_8_ = 0;
    puVar4 = (undefined8 *)operator_new(0x28);
    *puVar4 = local_108;
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
    ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                *)(puVar4 + 1),
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                *)&local_100);
    pcStack_140 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1312:23)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1312:23)>
                ::_M_manager;
    local_158._M_unused._M_object = puVar4;
    coap::CoapSecure::SendRequest(&this->mBrClient,&local_b8,(ResponseHandler *)&local_158);
    if (local_148 != (code *)0x0) {
      (*local_148)(&local_158,&local_158,__destroy_functor);
    }
    local_1d8 = (undefined1  [8])&local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"meshcop","");
    local_188 = (undefined1  [8])((ulong)(uint)local_188._4_4_ << 0x20);
    local_180._M_p = "sent petition request";
    local_178 = 0x15;
    local_170._M_allocated_capacity = 0;
    local_160[0] = (parse_func)0x0;
    pcVar6 = "sent petition request";
    local_170._8_8_ = (format_string_checker<char> *)local_188;
    do {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_188);
      }
      pcVar6 = pcVar5;
    } while (pcVar5 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_188;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_130,(v10 *)"sent petition request",(string_view)ZEXT816(0x15),args);
    Log(kDebug,(string *)local_1d8,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    paVar7 = &local_1c8;
    local_130._M_dataplus._M_p = (pointer)local_1d8;
  }
  else {
    local_188 = (undefined1  [8])((ulong)local_188 & 0xffffffff00000000);
    pcVar6 = "the commissioner is not started, petitioning, or already active";
    local_180._M_p = "the commissioner is not started, petitioning, or already active";
    local_178 = 0x3f;
    local_170._M_allocated_capacity = 0;
    local_160[0] = (parse_func)0x0;
    local_170._8_8_ = (format_string_checker<char> *)local_188;
    local_110.handler_ = (format_string_checker<char> *)local_188;
    do {
      cVar1 = *pcVar6;
      pcVar5 = pcVar6;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_110,pcVar6,"");
          goto LAB_001577e3;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_110,pcVar6,pcVar5);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",(format_string_checker<char> *)local_188);
    } while (pcVar6 != "");
LAB_001577e3:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_188;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_130,(v10 *)"the commissioner is not started, petitioning, or already active",
               (string_view)ZEXT816(0x3f),args_00);
    local_1d8._0_4_ = 0xf;
    local_1d0 = (pointer)(local_1c8._M_local_buf + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
    local_1b0 = local_1d8._0_4_;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1d0);
    if (local_1d0 != (pointer)(local_1c8._M_local_buf + 8)) {
      operator_delete(local_1d0);
    }
    paVar7 = &local_130.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar7) {
    operator_delete(local_130._M_dataplus._M_p);
  }
LAB_0015786b:
  if (local_1b0 != none_type) {
    local_e0._0_4_ = local_1b0;
    local_d8._M_p = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_1a8,local_1a8 + local_1a0);
    local_188 = (undefined1  [8])0x0;
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar8 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar8);
    }
    (*aHandler->_M_invoker)
              ((_Any_data *)aHandler,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_188,
               (Error *)local_e0);
    if (local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p);
    }
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  return;
}

Assistant:

void CommissionerImpl::SendPetition(PetitionHandler aHandler)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [this, aHandler](const coap::Response *aResponse, Error aError) {
        Error       error;
        tlv::TlvSet tlvSet;
        tlv::TlvPtr stateTlv          = nullptr;
        tlv::TlvPtr sessionIdTlv      = nullptr;
        tlv::TlvPtr commissionerIdTlv = nullptr;
        std::string existingCommissionerId;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = GetTlvSet(tlvSet, *aResponse));

        stateTlv = tlvSet[tlv::Type::kState];
        VerifyOrExit(stateTlv != nullptr, error = ERROR_BAD_FORMAT("no valid State TLV found in response"));
        if (stateTlv->GetValueAsInt8() != tlv::kStateAccept)
        {
            commissionerIdTlv = tlvSet[tlv::Type::kCommissionerId];
            if (commissionerIdTlv != nullptr && commissionerIdTlv->IsValid())
            {
                existingCommissionerId = commissionerIdTlv->GetValueAsString();
            }
            ExitNow(error = ERROR_REJECTED("petition was rejected"));
        }

        sessionIdTlv = tlvSet[tlv::Type::kCommissionerSessionId];
        VerifyOrExit(sessionIdTlv != nullptr,
                     error = ERROR_BAD_FORMAT("no valid Commissioner Session TLV found in response"));

        mSessionId = sessionIdTlv->GetValueAsUint16();
        mState     = State::kActive;
        mKeepAliveTimer.Start(GetKeepAliveInterval());

        LOG_INFO(LOG_REGION_MESHCOP, "petition succeed, start keep-alive timer with {} seconds",
                 GetKeepAliveInterval().count() / 1000);

    exit:
        if (error != ErrorCode::kNone)
        {
            mState = State::kDisabled;
        }
        aHandler(existingCommissionerId.empty() ? nullptr : &existingCommissionerId, error);
    };

    VerifyOrExit(mState == State::kConnected,
                 error = ERROR_INVALID_STATE("the commissioner is not started, petitioning, or already active"));
    SuccessOrExit(error = request.SetUriPath(uri::kPetitioning));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerId, mConfig.mId}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mState = State::kPetitioning;

    mBrClient.SendRequest(request, onResponse);

    LOG_DEBUG(LOG_REGION_MESHCOP, "sent petition request");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}